

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_numbers.c
# Opt level: O0

FIOBJ fiobj_float_tmp(double num)

{
  long lVar1;
  long *in_FS_OFFSET;
  undefined4 local_20;
  double num_local;
  
  lVar1 = *in_FS_OFFSET;
  local_20 = CONCAT31(local_20._1_3_,0x27);
  *(ulong *)(lVar1 + -0x270) = CONCAT44(0xfffffff,local_20);
  *(double *)(lVar1 + -0x268) = num;
  return *in_FS_OFFSET - 0x270;
}

Assistant:

FIOBJ fiobj_float_tmp(double num) {
  static __thread fiobj_float_s ret;
  ret = (fiobj_float_s){
      .head =
          {
              .type = FIOBJ_T_FLOAT,
              .ref = ((~(uint32_t)0) >> 4),
          },
      .f = num,
  };
  return (FIOBJ)&ret;
}